

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::stats_alert::message_abi_cxx11_(string *__return_storage_ptr__,stats_alert *this)

{
  string local_118;
  char msg [200];
  
  torrent_alert::message_abi_cxx11_(&local_118,&this->super_torrent_alert);
  snprintf(msg,200,"%s: [%d] %d %d %d %d %d %d %d %d %d %d",local_118._M_dataplus._M_p,
           (ulong)(uint)this->interval,(ulong)(uint)(this->transferred)._M_elems[0],
           (ulong)(uint)(this->transferred)._M_elems[1],(ulong)(uint)(this->transferred)._M_elems[2]
           ,(ulong)(uint)(this->transferred)._M_elems[3],
           (ulong)(uint)(this->transferred)._M_elems[4],(ulong)(uint)(this->transferred)._M_elems[5]
           ,(ulong)(uint)(this->transferred)._M_elems[6],
           (ulong)(uint)(this->transferred)._M_elems[7],(ulong)(uint)(this->transferred)._M_elems[8]
           ,(ulong)(uint)(this->transferred)._M_elems[9]);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,msg,(allocator<char> *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string stats_alert::message() const
	{
		char msg[200];
		std::snprintf(msg, sizeof(msg), "%s: [%d] %d %d %d %d %d %d"
#if TORRENT_ABI_VERSION == 1
			" %d %d %d %d"
#endif
			, torrent_alert::message().c_str()
			, interval
			, transferred[0]
			, transferred[1]
			, transferred[2]
			, transferred[3]
			, transferred[4]
			, transferred[5]
#if TORRENT_ABI_VERSION == 1
			, transferred[6]
			, transferred[7]
			, transferred[8]
			, transferred[9]
#endif
			);
		return msg;
	}